

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall sf2cute::SFZone::SFZone(SFZone *this,SFZone *origin)

{
  pointer puVar1;
  pointer puVar2;
  SFModulatorItem *pSVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  SFGenerator SVar6;
  pointer puVar7;
  pointer puVar8;
  __uniq_ptr_impl<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_> local_40
  ;
  vector<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>,std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>>
  *local_38;
  
  this->_vptr_SFZone = (_func_int **)&PTR__SFZone_0011d810;
  local_38 = (vector<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>,std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>>
              *)&this->modulators_;
  (this->generators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modulators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modulators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modulators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ::reserve(&this->generators_,
            (long)(origin->generators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(origin->generators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (origin->generators_).
           super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (origin->generators_).
                super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    std::make_unique<sf2cute::SFGeneratorItem,sf2cute::SFGeneratorItem&>
              ((SFGeneratorItem *)&local_40);
    std::
    vector<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>,std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>
              ((vector<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>,std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>>
                *)&this->generators_,
               (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
                *)&local_40);
    std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
                 *)&local_40);
  }
  std::
  vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ::reserve((vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
             *)local_38,
            (long)(origin->modulators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(origin->modulators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (origin->modulators_).
           super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (origin->modulators_).
                super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    pSVar3 = (puVar8->_M_t).
             super___uniq_ptr_impl<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
             .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl;
    local_40._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
    .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl =
         (tuple<sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>)
         operator_new(0x12);
    uVar5 = pSVar3->field_0x11;
    ((SFModulatorItem *)
    local_40._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
    .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl)->transform_op_ =
         pSVar3->transform_op_;
    ((SFModulatorItem *)
    local_40._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
    .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl)->field_0x11 = uVar5;
    uVar5 = (pSVar3->key_).field_0x5;
    SVar6 = (pSVar3->key_).destination_op_;
    uVar4 = *(undefined8 *)&(pSVar3->key_).amount_source_op_;
    (((SFModulatorItem *)
     local_40._M_t.
     super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
     .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl)->key_).source_op_ =
         (pSVar3->key_).source_op_;
    (((SFModulatorItem *)
     local_40._M_t.
     super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
     .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl)->key_).field_0x5 =
         uVar5;
    (((SFModulatorItem *)
     local_40._M_t.
     super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
     .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl)->key_).destination_op_
         = SVar6;
    *(undefined8 *)
     &(((SFModulatorItem *)
       local_40._M_t.
       super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
       .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl)->key_).
      amount_source_op_ = uVar4;
    std::
    vector<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>,std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>
              (local_38,(unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
                         *)&local_40);
    std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
                 *)&local_40);
  }
  return;
}

Assistant:

SFZone::SFZone(const SFZone & origin) {
  // Copy generators.
  generators_.reserve(origin.generators().size());
  for (const auto & generator : origin.generators()) {
    generators_.push_back(std::make_unique<SFGeneratorItem>(*generator));
  }

  // Copy modulators.
  modulators_.reserve(origin.modulators().size());
  for (const auto & modulator : origin.modulators()) {
    modulators_.push_back(std::make_unique<SFModulatorItem>(*modulator));
  }
}